

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::DataPageHeader::DataPageHeader(DataPageHeader *this,DataPageHeader *other62)

{
  type tVar1;
  type tVar2;
  type tVar3;
  
  *(undefined ***)this = &PTR__DataPageHeader_027d5080;
  Statistics::Statistics(&this->statistics);
  this->__isset = (_DataPageHeader__isset)((byte)this->__isset & 0xfe);
  tVar1 = other62->encoding;
  tVar2 = other62->definition_level_encoding;
  tVar3 = other62->repetition_level_encoding;
  this->num_values = other62->num_values;
  this->encoding = tVar1;
  this->definition_level_encoding = tVar2;
  this->repetition_level_encoding = tVar3;
  Statistics::operator=(&this->statistics,&other62->statistics);
  this->__isset = other62->__isset;
  return;
}

Assistant:

DataPageHeader::DataPageHeader(const DataPageHeader& other62) {
  num_values = other62.num_values;
  encoding = other62.encoding;
  definition_level_encoding = other62.definition_level_encoding;
  repetition_level_encoding = other62.repetition_level_encoding;
  statistics = other62.statistics;
  __isset = other62.__isset;
}